

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O0

void __thiscall Maybe_Emplace_Test::TestBody(Maybe_Emplace_Test *this)

{
  bool bVar1;
  no_copy_value *pnVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_170;
  Message local_168;
  int local_160;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__1;
  Message local_f8;
  int local_ec [3];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  Message local_58;
  int local_50 [4];
  int local_40;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  maybe<(anonymous_namespace)::no_copy_value,_void> m;
  Maybe_Emplace_Test *this_local;
  
  pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::maybe
            ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_);
  local_40 = 0xd;
  pnVar2 = pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::emplace<int>
                     ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_,
                      &local_40);
  local_3c = anon_unknown.dwarf_717f4::no_copy_value::get(pnVar2);
  local_50[0] = 0xd;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_38,"m.emplace (13).get ()","13",&local_3c,local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_71 = pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::has_value
                       ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_70,
               (AssertionResult *)"m.has_value ()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pnVar2 = pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::value
                     ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_);
  local_bc = anon_unknown.dwarf_717f4::no_copy_value::get(pnVar2);
  local_c0 = 0xd;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b8,"m.value ().get ()","13",&local_bc,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_ec[1] = 0x11;
  pnVar2 = pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::emplace<int>
                     ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_,
                      local_ec + 1);
  local_ec[2] = anon_unknown.dwarf_717f4::no_copy_value::get(pnVar2);
  local_ec[0] = 0x11;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e0,"m.emplace (17).get ()","17",local_ec + 2,local_ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_111 = pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::has_value
                        ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_110,
               (AssertionResult *)"m.has_value ()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  pnVar2 = pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::value
                     ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_);
  local_15c = anon_unknown.dwarf_717f4::no_copy_value::get(pnVar2);
  local_160 = 0x11;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_158,"m.value ().get ()","17",&local_15c,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pstore::maybe<(anonymous_namespace)::no_copy_value,_void>::~maybe
            ((maybe<(anonymous_namespace)::no_copy_value,_void> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST (Maybe, Emplace) {
    maybe<no_copy_value> m;
    EXPECT_EQ (m.emplace (13).get (), 13);
    EXPECT_TRUE (m.has_value ());
    EXPECT_EQ (m.value ().get (), 13);

    EXPECT_EQ (m.emplace (17).get (), 17);
    EXPECT_TRUE (m.has_value ());
    EXPECT_EQ (m.value ().get (), 17);
}